

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

int FindCollisions<unsigned_int>
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes,
              HashSet<unsigned_int> *collisions,int maxCollisions)

{
  value_type vVar1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar2;
  reference pvVar3;
  size_type sVar4;
  int in_EDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar5;
  size_t hnb;
  int collcount;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar6;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *this;
  int local_18;
  
  local_18 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffffa8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffffa8);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  psVar6 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x1;
  while (this = psVar6,
        psVar2 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI),
        psVar6 < psVar2) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(size_type)this);
    vVar1 = *pvVar3;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(size_type)
                               ((long)&this[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count + 7
                               ));
    if (vVar1 == *pvVar3) {
      local_18 = local_18 + 1;
      sVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)0x13445d);
      if ((int)sVar4 < in_EDX) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,(size_type)this)
        ;
        pVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                insert(this,(value_type_conflict1 *)
                            CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
        in_stack_ffffffffffffffc8 = pVar5.second;
      }
    }
    psVar6 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &(this->_M_t)._M_impl.field_0x1;
  }
  return local_18;
}

Assistant:

int FindCollisions ( std::vector<hashtype> & hashes,
                     HashSet<hashtype> & collisions,
                     int maxCollisions )
{
  int collcount = 0;

  std::sort(hashes.begin(),hashes.end());

  for(size_t hnb = 1; hnb < hashes.size(); hnb++)
  {
    if(hashes[hnb] == hashes[hnb-1])
    {
      collcount++;

      if((int)collisions.size() < maxCollisions)
      {
        collisions.insert(hashes[hnb]);
      }
    }
  }

  return collcount;
}